

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O2

TestStatus * __thiscall
vkt::api::anon_unknown_1::
createMultipleSharedResourcesTest<vkt::api::(anonymous_namespace)::Semaphore>
          (TestStatus *__return_storage_ptr__,anon_unknown_1 *this,Context *context,
          Parameters params)

{
  undefined4 in_register_0000000c;
  Parameters params_local;
  string local_f8;
  RefBase<vk::Handle<(vk::HandleType)4>_> local_d8;
  RefBase<vk::Handle<(vk::HandleType)4>_> local_b8;
  RefBase<vk::Handle<(vk::HandleType)4>_> local_98;
  RefBase<vk::Handle<(vk::HandleType)4>_> local_78;
  Environment env;
  
  params_local.flags = (VkSemaphoreCreateFlags)context;
  Environment::Environment(&env,(Context *)this,4);
  Semaphore::create((Move<vk::Handle<(vk::HandleType)4>_> *)&local_b8,&env,
                    (Resources *)&params_local,
                    (Parameters *)CONCAT44(in_register_0000000c,params.flags));
  local_f8.field_2._M_allocated_capacity = (size_type)local_b8.m_data.deleter.m_device;
  local_f8.field_2._8_8_ = local_b8.m_data.deleter.m_allocator;
  local_f8._M_dataplus._M_p = (pointer)local_b8.m_data.object.m_internal;
  local_f8._M_string_length = (size_type)local_b8.m_data.deleter.m_deviceIface;
  local_b8.m_data.object.m_internal = 0;
  local_b8.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  local_b8.m_data.deleter.m_device = (VkDevice)0x0;
  local_b8.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)4>_>::~RefBase(&local_b8);
  Semaphore::create((Move<vk::Handle<(vk::HandleType)4>_> *)&local_d8,&env,
                    (Resources *)&params_local,
                    (Parameters *)CONCAT44(in_register_0000000c,params.flags));
  local_b8.m_data.deleter.m_device = local_d8.m_data.deleter.m_device;
  local_b8.m_data.deleter.m_allocator = local_d8.m_data.deleter.m_allocator;
  local_b8.m_data.object.m_internal = local_d8.m_data.object.m_internal;
  local_b8.m_data.deleter.m_deviceIface = local_d8.m_data.deleter.m_deviceIface;
  local_d8.m_data.object.m_internal = 0;
  local_d8.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  local_d8.m_data.deleter.m_device = (VkDevice)0x0;
  local_d8.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)4>_>::~RefBase(&local_d8);
  Semaphore::create((Move<vk::Handle<(vk::HandleType)4>_> *)&local_98,&env,
                    (Resources *)&params_local,
                    (Parameters *)CONCAT44(in_register_0000000c,params.flags));
  local_d8.m_data.deleter.m_device = local_98.m_data.deleter.m_device;
  local_d8.m_data.deleter.m_allocator = local_98.m_data.deleter.m_allocator;
  local_d8.m_data.object.m_internal = local_98.m_data.object.m_internal;
  local_d8.m_data.deleter.m_deviceIface = local_98.m_data.deleter.m_deviceIface;
  local_98.m_data.object.m_internal = 0;
  local_98.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  local_98.m_data.deleter.m_device = (VkDevice)0x0;
  local_98.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)4>_>::~RefBase(&local_98);
  Semaphore::create((Move<vk::Handle<(vk::HandleType)4>_> *)&local_78,&env,
                    (Resources *)&params_local,
                    (Parameters *)CONCAT44(in_register_0000000c,params.flags));
  local_98.m_data.deleter.m_device = local_78.m_data.deleter.m_device;
  local_98.m_data.deleter.m_allocator = local_78.m_data.deleter.m_allocator;
  local_98.m_data.object.m_internal = local_78.m_data.object.m_internal;
  local_98.m_data.deleter.m_deviceIface = local_78.m_data.deleter.m_deviceIface;
  local_78.m_data.object.m_internal = 0;
  local_78.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  local_78.m_data.deleter.m_device = (VkDevice)0x0;
  local_78.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)4>_>::~RefBase(&local_78);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)4>_>::~RefBase(&local_98);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)4>_>::~RefBase(&local_d8);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)4>_>::~RefBase(&local_b8);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)4>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)4>_> *)&local_f8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f8,"Ok",(allocator<char> *)&local_b8);
  tcu::TestStatus::pass(__return_storage_ptr__,&local_f8);
  std::__cxx11::string::~string((string *)&local_f8);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus createMultipleSharedResourcesTest (Context& context, typename Object::Parameters params)
{
	const Environment					env	(context, 4u);
	const typename Object::Resources	res	(env, params);

	{
		Unique<typename Object::Type>	obj0	(Object::create(env, res, params));
		Unique<typename Object::Type>	obj1	(Object::create(env, res, params));
		Unique<typename Object::Type>	obj2	(Object::create(env, res, params));
		Unique<typename Object::Type>	obj3	(Object::create(env, res, params));
	}

	return tcu::TestStatus::pass("Ok");
}